

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webmdec.cc
# Opt level: O0

int webm_read_frame(WebmInputContext *webm_ctx,uint8_t **buffer,size_t *bytes_read,
                   size_t *buffer_size)

{
  long *plVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  longlong lVar5;
  Frame *pFVar6;
  void *pvVar7;
  long lVar8;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  undefined8 *in_RDI;
  ulong uVar9;
  MkvReader *reader;
  Frame *frame;
  bool get_new_block;
  long status;
  bool block_entry_eos;
  BlockEntry *block_entry;
  Block *block;
  Cluster *cluster;
  Segment *segment;
  uchar *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  BlockEntry **in_stack_ffffffffffffff90;
  Cluster *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  byte bVar10;
  Cluster *this;
  Block *local_40;
  Cluster *local_38;
  int local_4;
  
  if (*(int *)((long)in_RDI + 0x44) == 0) {
    local_38 = (Cluster *)in_RDI[3];
    local_40 = (Block *)in_RDI[5];
    plVar1 = (long *)in_RDI[4];
    bVar3 = false;
    do {
      this = (Cluster *)0x0;
      bVar10 = 0;
      if ((plVar1 != (long *)0x0) || (bVar3)) {
        if ((bVar3) || (bVar2 = mkvparser::BlockEntry::EOS((BlockEntry *)0x120d2f), bVar2)) {
          local_38 = mkvparser::Segment::GetNext((Segment *)bytes_read,(Cluster *)buffer_size);
          if ((local_38 == (Cluster *)0x0) || (bVar3 = mkvparser::Cluster::EOS(local_38), bVar3)) {
            *in_RDX = 0;
            *(undefined4 *)((long)in_RDI + 0x44) = 1;
            return 1;
          }
          this = (Cluster *)
                 mkvparser::Cluster::GetFirst(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
          bVar3 = false;
          bVar10 = 1;
          goto LAB_00120e2a;
        }
        if (local_40 != (Block *)0x0) {
          in_stack_ffffffffffffff8c = *(int *)(in_RDI + 6);
          iVar4 = mkvparser::Block::GetFrameCount(local_40);
          if ((in_stack_ffffffffffffff8c != iVar4) &&
             (lVar5 = mkvparser::Block::GetTrackNumber(local_40),
             lVar5 == *(int *)((long)in_RDI + 0x34))) goto LAB_00120e2a;
        }
        this = (Cluster *)
               mkvparser::Cluster::GetNext
                         (this,(BlockEntry *)CONCAT17(bVar10,in_stack_ffffffffffffffa0),
                          (BlockEntry **)in_stack_ffffffffffffff98);
        if ((plVar1 != (long *)0x0) &&
           (bVar2 = mkvparser::BlockEntry::EOS((BlockEntry *)0x120e14), !bVar2)) {
          bVar10 = 1;
          goto LAB_00120e2a;
        }
        bVar3 = true;
      }
      else {
        this = (Cluster *)
               mkvparser::Cluster::GetFirst(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
        bVar10 = 1;
LAB_00120e2a:
        if ((this != (Cluster *)0x0) || (plVar1 == (long *)0x0)) {
          return -1;
        }
        if ((bVar10 & 1) != 0) {
          local_40 = (Block *)(**(code **)(*plVar1 + 0x10))();
          if (local_40 == (Block *)0x0) {
            return -1;
          }
          *(undefined4 *)(in_RDI + 6) = 0;
        }
      }
      in_stack_ffffffffffffff88 = CONCAT13(1,(int3)in_stack_ffffffffffffff88);
      if (!bVar3) {
        lVar5 = mkvparser::Block::GetTrackNumber(local_40);
        in_stack_ffffffffffffff88 =
             CONCAT13(lVar5 != *(int *)((long)in_RDI + 0x34),(int3)in_stack_ffffffffffffff88);
      }
    } while ((char)((uint)in_stack_ffffffffffffff88 >> 0x18) != '\0');
    in_RDI[3] = local_38;
    in_RDI[4] = plVar1;
    in_RDI[5] = local_40;
    pFVar6 = mkvparser::Block::GetFrame(local_40,*(int *)(in_RDI + 6));
    *(int *)(in_RDI + 6) = *(int *)(in_RDI + 6) + 1;
    if (*in_RCX < pFVar6->len) {
      in_stack_ffffffffffffff80 = (uchar *)*in_RSI;
      if (in_stack_ffffffffffffff80 != (uchar *)0x0) {
        operator_delete__(in_stack_ffffffffffffff80);
      }
      uVar9 = pFVar6->len;
      if ((long)uVar9 < 0) {
        uVar9 = 0xffffffffffffffff;
      }
      pvVar7 = operator_new__(uVar9);
      *in_RSI = (long)pvVar7;
      in_RDI[2] = *in_RSI;
      if (*in_RSI == 0) {
        return -1;
      }
      *in_RCX = pFVar6->len;
    }
    *in_RDX = pFVar6->len;
    lVar5 = mkvparser::Block::GetTime
                      ((Block *)this,(Cluster *)CONCAT17(bVar10,in_stack_ffffffffffffffa0));
    in_RDI[7] = lVar5;
    bVar3 = mkvparser::Block::IsKey(local_40);
    *(uint *)(in_RDI + 8) = (uint)bVar3;
    lVar8 = mkvparser::Block::Frame::Read
                      ((Frame *)*in_RDI,
                       (IMkvReader *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                       in_stack_ffffffffffffff80);
    local_4 = 0;
    if (lVar8 != 0) {
      local_4 = -1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int webm_read_frame(struct WebmInputContext *webm_ctx, uint8_t **buffer,
                    size_t *bytes_read, size_t *buffer_size) {
  assert(webm_ctx->buffer == *buffer);
  // This check is needed for frame parallel decoding, in which case this
  // function could be called even after it has reached end of input stream.
  if (webm_ctx->reached_eos) {
    return 1;
  }
  mkvparser::Segment *const segment =
      reinterpret_cast<mkvparser::Segment *>(webm_ctx->segment);
  const mkvparser::Cluster *cluster =
      reinterpret_cast<const mkvparser::Cluster *>(webm_ctx->cluster);
  const mkvparser::Block *block =
      reinterpret_cast<const mkvparser::Block *>(webm_ctx->block);
  const mkvparser::BlockEntry *block_entry =
      reinterpret_cast<const mkvparser::BlockEntry *>(webm_ctx->block_entry);
  bool block_entry_eos = false;
  do {
    long status = 0;
    bool get_new_block = false;
    if (block_entry == NULL && !block_entry_eos) {
      status = cluster->GetFirst(block_entry);
      get_new_block = true;
    } else if (block_entry_eos || block_entry->EOS()) {
      cluster = segment->GetNext(cluster);
      if (cluster == NULL || cluster->EOS()) {
        *bytes_read = 0;
        webm_ctx->reached_eos = 1;
        return 1;
      }
      status = cluster->GetFirst(block_entry);
      block_entry_eos = false;
      get_new_block = true;
    } else if (block == NULL ||
               webm_ctx->block_frame_index == block->GetFrameCount() ||
               block->GetTrackNumber() != webm_ctx->video_track_index) {
      status = cluster->GetNext(block_entry, block_entry);
      if (block_entry == NULL || block_entry->EOS()) {
        block_entry_eos = true;
        continue;
      }
      get_new_block = true;
    }
    if (status || block_entry == NULL) {
      return -1;
    }
    if (get_new_block) {
      block = block_entry->GetBlock();
      if (block == NULL) return -1;
      webm_ctx->block_frame_index = 0;
    }
  } while (block_entry_eos ||
           block->GetTrackNumber() != webm_ctx->video_track_index);

  webm_ctx->cluster = cluster;
  webm_ctx->block_entry = block_entry;
  webm_ctx->block = block;

  const mkvparser::Block::Frame &frame =
      block->GetFrame(webm_ctx->block_frame_index);
  ++webm_ctx->block_frame_index;
  if (frame.len > static_cast<long>(*buffer_size)) {
    delete[] * buffer;
    *buffer = new uint8_t[frame.len];
    webm_ctx->buffer = *buffer;
    if (*buffer == NULL) {
      return -1;
    }
    *buffer_size = frame.len;
  }
  *bytes_read = frame.len;
  webm_ctx->timestamp_ns = block->GetTime(cluster);
  webm_ctx->is_key_frame = block->IsKey();

  mkvparser::MkvReader *const reader =
      reinterpret_cast<mkvparser::MkvReader *>(webm_ctx->reader);
  return frame.Read(reader, *buffer) ? -1 : 0;
}